

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O1

bool __thiscall
deqp::gles3::Performance::ShaderCompilerCase::linkAndUseProgram
          (ShaderCompilerCase *this,deUint32 program)

{
  int iVar1;
  undefined4 extraout_var;
  GLint linkStatus;
  int local_1c;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  local_1c = 0;
  (**(code **)(lVar2 + 0xce8))(program);
  (**(code **)(lVar2 + 0x9d8))(program,0x8b82,&local_1c);
  if (local_1c != 0) {
    (**(code **)(lVar2 + 0x1680))(program);
  }
  return local_1c != 0;
}

Assistant:

bool ShaderCompilerCase::linkAndUseProgram (deUint32 program) const
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();
	GLint linkStatus = 0;

	gl.linkProgram(program);
	gl.getProgramiv(program, GL_LINK_STATUS, &linkStatus);

	if (linkStatus != 0)
		gl.useProgram(program);

	return linkStatus != 0;
}